

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

ggml_cgraph *
clip_image_build_graph
          (clip_ctx *ctx,clip_image_f32_batch *imgs,clip_image_size load_image_size,bool is_inf)

{
  long in_RDI;
  ggml_cgraph *res;
  clip_image_f32_batch *in_stack_00000368;
  clip_ctx *in_stack_00000370;
  clip_image_f32_batch *in_stack_00000438;
  clip_ctx *in_stack_00000440;
  bool in_stack_00000ba7;
  clip_image_f32_batch *in_stack_00000ba8;
  clip_ctx *in_stack_00000bb0;
  clip_image_size in_stack_00000bb8;
  undefined8 local_28;
  
  if (*(int *)(in_RDI + 0x300) - 7U < 2) {
    local_28 = clip_image_build_graph_siglip(in_stack_00000440,in_stack_00000438);
  }
  else if (*(int *)(in_RDI + 0x300) == 9) {
    local_28 = clip_image_build_graph_pixtral(in_stack_00000370,in_stack_00000368);
  }
  else {
    local_28 = clip_image_build_graph_legacy
                         (in_stack_00000bb0,in_stack_00000ba8,in_stack_00000bb8,in_stack_00000ba7);
  }
  return local_28;
}

Assistant:

static ggml_cgraph * clip_image_build_graph(clip_ctx * ctx, const clip_image_f32_batch & imgs, struct clip_image_size load_image_size, bool is_inf = false) {
    ggml_cgraph * res;
    switch (ctx->proj_type) {
        case PROJECTOR_TYPE_GEMMA3:
        case PROJECTOR_TYPE_IDEFICS3:
            {
                res = clip_image_build_graph_siglip(ctx, imgs);
            } break;
        case PROJECTOR_TYPE_PIXTRAL:
            {
                res = clip_image_build_graph_pixtral(ctx, imgs);
            } break;
        default:
            {
                // TODO: we should have one build_* function per model
                res = clip_image_build_graph_legacy(ctx, imgs, load_image_size, is_inf);
            } break;
    }
    return res;
}